

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O2

void __thiscall RandomBotStrategy::RandomBotStrategy(RandomBotStrategy *this,Player *player)

{
  int *piVar1;
  Player *this_00;
  string *this_01;
  allocator<char> local_19;
  
  PlayerStrategy::PlayerStrategy(&this->super_PlayerStrategy);
  (this->super_PlayerStrategy)._vptr_PlayerStrategy = (_func_int **)&PTR_yesOrNo_0013a968;
  piVar1 = (int *)operator_new(4);
  *piVar1 = 0;
  (this->super_PlayerStrategy).armiesToPlace = piVar1;
  this_00 = (Player *)operator_new(0x38);
  Player::Player(this_00,player);
  (this->super_PlayerStrategy).player = this_00;
  (this->super_PlayerStrategy).from = (Country *)0x0;
  (this->super_PlayerStrategy).to = (Country *)0x0;
  this_01 = (string *)operator_new(0x20);
  std::__cxx11::string::string<std::allocator<char>>((string *)this_01,"RANDOM",&local_19);
  (this->super_PlayerStrategy).strategyName = this_01;
  return;
}

Assistant:

RandomBotStrategy::RandomBotStrategy(const Player& player) {
    this->armiesToPlace = new int(0);
    this->player = new Player(player);
    this->from = nullptr;
    this->to = nullptr;
    this->strategyName = new std::string("RANDOM");
}